

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFArgParser.cc
# Opt level: O2

void __thiscall
QPDFArgParser::insertCompletions
          (QPDFArgParser *this,option_table_t *option_table,string *choice_option,
          string *extra_prefix)

{
  element_type *peVar1;
  char *pcVar2;
  
  if (choice_option->_M_string_length != 0) {
    addChoicesToCompletions(this,option_table,choice_option,extra_prefix);
    return;
  }
  peVar1 = (this->m).super___shared_ptr<QPDFArgParser::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->bash_cur)._M_string_length != 0) {
    pcVar2 = (char *)std::__cxx11::string::at((ulong)&peVar1->bash_cur);
    if (*pcVar2 == '-') {
      addOptionsToCompletions(this,option_table);
      return;
    }
  }
  return;
}

Assistant:

void
QPDFArgParser::insertCompletions(
    option_table_t& option_table, std::string const& choice_option, std::string const& extra_prefix)
{
    if (!choice_option.empty()) {
        addChoicesToCompletions(option_table, choice_option, extra_prefix);
    } else if ((!m->bash_cur.empty()) && (m->bash_cur.at(0) == '-')) {
        addOptionsToCompletions(option_table);
    }
}